

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O0

greatest_test_res
validate_with_slow_max_flow(FlowNetwork *net,int32_t s,int32_t t,MaxFlowResult *result)

{
  undefined1 local_80 [8];
  MaxFlow bf_maxflow;
  MaxFlowResult bf_result;
  MaxFlowResult *result_local;
  int32_t t_local;
  int32_t s_local;
  FlowNetwork *net_local;
  
  max_flow_result_create((MaxFlowResult *)((long)&bf_maxflow.payload + 0x28),net->nnodes);
  memset(local_80,0,0x40);
  max_flow_create((MaxFlow *)local_80,net->nnodes,MAXFLOW_ALGO_BRUTEFORCE);
  max_flow_single_pair
            (net,(MaxFlow *)local_80,s,t,(MaxFlowResult *)((long)&bf_maxflow.payload + 0x28));
  greatest_info.assertions = greatest_info.assertions + 1;
  if (bf_result.s == result->maxflow) {
    max_flow_result_destroy((MaxFlowResult *)((long)&bf_maxflow.payload + 0x28));
    max_flow_destroy((MaxFlow *)local_80);
    greatest_info.msg = (char *)0x0;
    net_local._4_4_ = GREATEST_TEST_RES_PASS;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
    ;
    greatest_info.fail_line = 0x2e;
    greatest_info.msg = "bf_result.maxflow != result->maxflow";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    net_local._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  return net_local._4_4_;
}

Assistant:

TEST validate_with_slow_max_flow(FlowNetwork *net, int32_t s, int32_t t,
                                 MaxFlowResult *result) {
    MaxFlowResult bf_result;
    max_flow_result_create(&bf_result, net->nnodes);

    MaxFlow bf_maxflow = {0};
    max_flow_create(&bf_maxflow, net->nnodes, MAXFLOW_ALGO_BRUTEFORCE);

    max_flow_single_pair(net, &bf_maxflow, s, t, &bf_result);
    ASSERT_EQ(bf_result.maxflow, result->maxflow);

    max_flow_result_destroy(&bf_result);
    max_flow_destroy(&bf_maxflow);

    PASS();
}